

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

void Llb_ManMinCutTest(Aig_Man_t *pAig,int Num)

{
  Aig_Man_t *p_00;
  Vec_Ptr_t *vResult_00;
  Aig_Man_t *p;
  Vec_Ptr_t *vResult;
  Gia_ParLlb_t *pPars;
  Gia_ParLlb_t Pars;
  int Num_local;
  Aig_Man_t *pAig_local;
  
  Pars._108_4_ = Num;
  Llb_BddSetDefaultParams((Gia_ParLlb_t *)&pPars);
  p_00 = Aig_ManDupFlopsOnly(pAig);
  Aig_ManPrintStats(pAig);
  Aig_ManPrintStats(p_00);
  Aig_ManFanoutStart(p_00);
  vResult_00 = Llb_ManComputeCuts(p_00,Pars._108_4_,1,0);
  Llb_CoreExperiment(pAig,p_00,(Gia_ParLlb_t *)&pPars,vResult_00,0);
  Vec_VecFree((Vec_Vec_t *)vResult_00);
  Aig_ManFanoutStop(p_00);
  Aig_ManCleanMarkAB(p_00);
  Aig_ManStop(p_00);
  return;
}

Assistant:

void Llb_ManMinCutTest( Aig_Man_t * pAig, int Num )
{
    extern void Llb_BddConstructTest( Aig_Man_t * p, Vec_Ptr_t * vResult );
    extern void Llb_BddExperiment( Aig_Man_t * pInit, Aig_Man_t * pAig, Gia_ParLlb_t * pPars, Vec_Ptr_t * vResult, Vec_Ptr_t * vMaps );
 

//    int fVerbose = 1;
    Gia_ParLlb_t Pars, * pPars = &Pars;
    Vec_Ptr_t * vResult;//, * vSupps, * vMaps;
    Aig_Man_t * p;

    Llb_BddSetDefaultParams( pPars );

    p = Aig_ManDupFlopsOnly( pAig );
//Aig_ManShow( p, 0, NULL );
    Aig_ManPrintStats( pAig );
    Aig_ManPrintStats( p );
    Aig_ManFanoutStart( p );

    vResult = Llb_ManComputeCuts( p, Num, 1, 0 );
//    vSupps  = Llb_ManCutSupps( p, vResult );
//    vMaps   = Llb_ManCutMap( p, vResult, vSupps );

//    Llb_BddExperiment( pAig, p, pPars, vResult, vMaps );
    Llb_CoreExperiment( pAig, p, pPars, vResult, 0 );

//    Vec_VecFree( (Vec_Vec_t *)vMaps );
//    Vec_VecFree( (Vec_Vec_t *)vSupps );
    Vec_VecFree( (Vec_Vec_t *)vResult );

    Aig_ManFanoutStop( p );
    Aig_ManCleanMarkAB( p );
    Aig_ManStop( p );
}